

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simUtils.c
# Opt level: O3

Vec_Int_t * Sim_UtilCountOnesArray(Vec_Ptr_t *vInfo,int nSimWords)

{
  uint uVar1;
  void **ppvVar2;
  uint uVar3;
  Vec_Int_t *pVVar4;
  int *__s;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  
  uVar1 = vInfo->nSize;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  uVar3 = 0x10;
  if (0xe < uVar1 - 1) {
    uVar3 = uVar1;
  }
  pVVar4->nCap = uVar3;
  if (uVar3 == 0) {
    pVVar4->pArray = (int *)0x0;
    pVVar4->nSize = uVar1;
  }
  else {
    __s = (int *)malloc((long)(int)uVar3 << 2);
    pVVar4->pArray = __s;
    pVVar4->nSize = uVar1;
    if (__s != (int *)0x0) {
      memset(__s,0,(long)(int)uVar1 << 2);
      goto LAB_004d707e;
    }
  }
  __s = (int *)0x0;
LAB_004d707e:
  if (0 < (int)uVar1) {
    ppvVar2 = vInfo->pArray;
    uVar5 = 1;
    if (1 < nSimWords * 4) {
      uVar5 = (ulong)(uint)(nSimWords * 4);
    }
    uVar6 = 0;
    do {
      iVar7 = 0;
      if (0 < nSimWords) {
        uVar8 = 0;
        iVar7 = 0;
        do {
          iVar7 = iVar7 + bit_count[*(byte *)((long)ppvVar2[uVar6] + uVar8)];
          uVar8 = uVar8 + 1;
        } while (uVar5 != uVar8);
      }
      if (uVar6 == uVar1) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      __s[uVar6] = iVar7;
      uVar6 = uVar6 + 1;
    } while (uVar6 < uVar1);
  }
  return pVVar4;
}

Assistant:

Vec_Int_t * Sim_UtilCountOnesArray( Vec_Ptr_t * vInfo, int nSimWords )
{
    Vec_Int_t * vCounters;
    unsigned * pSimInfo;
    int i;
    vCounters = Vec_IntStart( Vec_PtrSize(vInfo) );
    Vec_PtrForEachEntry( unsigned *, vInfo, pSimInfo, i )
        Vec_IntWriteEntry( vCounters, i, Sim_UtilCountOnes(pSimInfo, nSimWords) );
    return vCounters;
}